

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QTransform *t)

{
  QTransform *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  double m33;
  double m32;
  double m31;
  double m23;
  double m22;
  double m21;
  double m13;
  double m12;
  double m11;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = -NAN;
  local_18 = -NAN;
  local_20 = -NAN;
  local_28 = -NAN;
  local_30 = -NAN;
  local_38 = -NAN;
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  QDataStream::operator>>(in_RDI,&local_10);
  QDataStream::operator>>(in_RDI,&local_18);
  QDataStream::operator>>(in_RDI,&local_20);
  QDataStream::operator>>(in_RDI,&local_28);
  QDataStream::operator>>(in_RDI,&local_30);
  QDataStream::operator>>(in_RDI,&local_38);
  QDataStream::operator>>(in_RDI,&local_40);
  QDataStream::operator>>(in_RDI,&local_48);
  QDataStream::operator>>(in_RDI,&local_50);
  QTransform::setMatrix
            (in_RSI,local_10,local_18,local_20,local_28,local_30,local_38,local_40,local_48,local_50
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream & operator>>(QDataStream &s, QTransform &t)
{
     double m11, m12, m13,
         m21, m22, m23,
         m31, m32, m33;

     s >> m11;
     s >> m12;
     s >> m13;
     s >> m21;
     s >> m22;
     s >> m23;
     s >> m31;
     s >> m32;
     s >> m33;
     t.setMatrix(m11, m12, m13,
                 m21, m22, m23,
                 m31, m32, m33);
     return s;
}